

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O1

bool __thiscall dap::json::JsonCppSerializer::serialize(JsonCppSerializer *this,any *v)

{
  TypeInfo *pTVar1;
  int iVar2;
  TypeInfo *pTVar3;
  char *__function;
  Value local_40;
  
  pTVar1 = v->type;
  pTVar3 = TypeOf<dap::boolean>::type();
  if (pTVar1 == pTVar3) {
    pTVar1 = v->type;
    pTVar3 = TypeOf<dap::boolean>::type();
    if (pTVar1 == pTVar3) {
      Json::Value::Value(&local_40,*v->value);
LAB_00807d13:
      Json::Value::operator=(this->json,&local_40);
      Json::Value::~Value(&local_40);
      return true;
    }
    __function = "T &dap::any::get() const [T = dap::boolean]";
  }
  else {
    pTVar1 = v->type;
    pTVar3 = TypeOf<dap::integer>::type();
    if (pTVar1 == pTVar3) {
      pTVar1 = v->type;
      pTVar3 = TypeOf<dap::integer>::type();
      if (pTVar1 == pTVar3) {
        Json::Value::Value(&local_40,*v->value);
        goto LAB_00807d13;
      }
      __function = "T &dap::any::get() const [T = dap::integer]";
    }
    else {
      pTVar1 = v->type;
      pTVar3 = TypeOf<dap::number>::type();
      if (pTVar1 == pTVar3) {
        pTVar1 = v->type;
        pTVar3 = TypeOf<dap::number>::type();
        if (pTVar1 == pTVar3) {
          Json::Value::Value(&local_40,*v->value);
          goto LAB_00807d13;
        }
        __function = "T &dap::any::get() const [T = dap::number]";
      }
      else {
        pTVar1 = v->type;
        pTVar3 = TypeOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::type();
        if (pTVar1 == pTVar3) {
          pTVar1 = v->type;
          pTVar3 = TypeOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::type();
          if (pTVar1 == pTVar3) {
            Json::Value::Value(&local_40,(String *)v->value);
            goto LAB_00807d13;
          }
          __function = "T &dap::any::get() const [T = std::basic_string<char>]";
        }
        else {
          pTVar1 = v->type;
          pTVar3 = TypeOf<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>_>
                   ::type();
          if (pTVar1 != pTVar3) {
            if (v->value == (void *)0x0) {
              return true;
            }
            pTVar1 = v->type;
            if (pTVar1 != (TypeInfo *)0x0) {
              iVar2 = (*pTVar1->_vptr_TypeInfo[9])(pTVar1,this);
              return SUB41(iVar2,0);
            }
            return false;
          }
          pTVar1 = v->type;
          pTVar3 = TypeOf<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>_>
                   ::type();
          if (pTVar1 == pTVar3) {
            iVar2 = (*(this->super_Serializer)._vptr_Serializer[6])(this,v->value);
            return SUB41(iVar2,0);
          }
          __function = 
          "T &dap::any::get() const [T = std::unordered_map<std::basic_string<char>, dap::any>]";
        }
      }
    }
  }
  __assert_fail("is<T>()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                ,0xa4,__function);
}

Assistant:

bool JsonCppSerializer::serialize(const dap::any& v) {
  if (v.is<dap::boolean>()) {
    *json = (bool)v.get<dap::boolean>();
  } else if (v.is<dap::integer>()) {
    *json = (Json::LargestInt)v.get<dap::integer>();
  } else if (v.is<dap::number>()) {
    *json = (double)v.get<dap::number>();
  } else if (v.is<dap::string>()) {
    *json = v.get<dap::string>();
  } else if (v.is<dap::object>()) {
    // reachable if dap::object nested is inside other dap::object
    return serialize(v.get<dap::object>());
  } else if (v.is<dap::null>()) {
  } else {
    // reachable if array or custom serialized type is nested inside other
    auto type = get_any_type(v);
    auto value = get_any_val(v);
    if (type && value) {
      return type->serialize(this, value);
    }
    return false;
  }
  return true;
}